

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawRadioButton
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_3)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ControlPixmap CVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QPixmapStylePixmap QStack_98;
  ControlPixmap local_6c [9];
  QPixmap local_48 [16];
  double local_38;
  double local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  bVar5 = (uVar1 & 0x20) != 0;
  CVar4 = RB_Checked;
  if (!bVar5) {
    CVar4 = ((uVar1 & 4) >> 1) + RB_Enabled;
  }
  local_6c[0] = bVar5 + RB_Disabled;
  if ((uVar1 & 1) != 0) {
    local_6c[0] = CVar4;
  }
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            (&QStack_98,
             (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)
             (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xf0),local_6c);
  uVar2 = (option->rect).x1;
  uVar3 = (option->rect).y1;
  local_48._8_4_ = SUB84((double)(int)uVar3,0);
  local_48._0_8_ = (double)(int)uVar2;
  local_48._12_4_ = (int)((ulong)(double)(int)uVar3 >> 0x20);
  local_38 = (double)(((long)(option->rect).x2.m_i - (long)(int)uVar2) + 1);
  local_30 = (double)(((long)(option->rect).y2.m_i - (long)(int)uVar3) + 1);
  local_6c[5] = CB_Enabled;
  local_6c[6] = CB_Enabled;
  local_6c[7] = CB_Enabled;
  local_6c[8] = CB_Enabled;
  local_6c[1] = CB_Enabled;
  local_6c[2] = CB_Enabled;
  local_6c[3] = CB_Enabled;
  local_6c[4] = CB_Enabled;
  QPainter::drawPixmap((QRectF *)painter,local_48,(QRectF *)&QStack_98);
  QPixmap::~QPixmap(&QStack_98.pixmap);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawRadioButton(const QStyleOption *option,
                                   QPainter *painter, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    const QStyleOptionButton *button = qstyleoption_cast<const QStyleOptionButton*>(option);

    const bool down = button->state & State_Sunken;
    const bool enabled = button->state & State_Enabled;
    const bool on = button->state & State_On;

    ControlPixmap control;
    if (enabled)
        control = on ? RB_Checked : (down ? RB_Pressed : RB_Enabled);
    else
        control = on ? RB_DisabledChecked : RB_Disabled;
    painter->drawPixmap(button->rect, d->pixmaps.value(control).pixmap);
}